

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O3

errr finish_parse_artifact(parser *p)

{
  ushort uVar1;
  void *pvVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  angband_constants *paVar6;
  artifact *paVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  void *pvVar10;
  object *poVar11;
  object_kind *poVar12;
  uint16_t uVar13;
  bitflag *pbVar14;
  ulong uVar15;
  curse *pcVar16;
  long lVar17;
  
  z_info->a_max = 0;
  pvVar10 = parser_priv(p);
  uVar13 = z_info->a_max;
  if (pvVar10 != (void *)0x0) {
    do {
      uVar13 = uVar13 + 1;
      pvVar10 = *(void **)((long)pvVar10 + 0x18);
    } while (pvVar10 != (void *)0x0);
    z_info->a_max = uVar13;
  }
  a_info = (artifact *)mem_zalloc((ulong)((uint)uVar13 * 0x140) + 0x140);
  aup_info = (artifact_upkeep *)mem_zalloc((ulong)z_info->a_max * 8 + 8);
  uVar1 = z_info->a_max;
  uVar15 = (ulong)uVar1;
  pvVar10 = parser_priv(p);
  if (pvVar10 != (void *)0x0) {
    lVar17 = (ulong)(((uint)uVar1 * 4 + (uint)uVar1) * 0x40) + 0x140;
    do {
      if ((long)uVar15 < 1) {
        __assert_fail("aidx > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-init.c"
                      ,0xcc0,"errr finish_parse_artifact(struct parser *)");
      }
      memcpy(a_info[-1].flags + lVar17 + -0x3c,pvVar10,0x140);
      *(uint32_t *)((long)a_info + lVar17 + -0x130) = (uint32_t)uVar15;
      pvVar2 = *(void **)((long)pvVar10 + 0x18);
      pbVar14 = a_info->flags + lVar17 + -0x3c;
      if (z_info->a_max <= uVar15) {
        pbVar14 = (bitflag *)0x0;
      }
      *(bitflag **)((long)a_info + lVar17 + -0x128) = pbVar14;
      mem_free(pvVar10);
      aup_info[uVar15].aidx = (uint32_t)uVar15;
      uVar15 = uVar15 - 1;
      lVar17 = lVar17 + -0x140;
      pvVar10 = pvVar2;
    } while (pvVar2 != (void *)0x0);
  }
  z_info->a_max = z_info->a_max + 1;
  wVar8 = tval_find_idx("none");
  wVar9 = lookup_sval(wVar8,"<unknown item>");
  unknown_item_kind = lookup_kind(wVar8,wVar9);
  wVar9 = lookup_sval(wVar8,"<unknown treasure>");
  unknown_gold_kind = lookup_kind(wVar8,wVar9);
  wVar9 = lookup_sval(wVar8,"<pile>");
  pile_kind = lookup_kind(wVar8,wVar9);
  wVar9 = lookup_sval(wVar8,"<curse object>");
  curse_object_kind = lookup_kind(wVar8,wVar9);
  wVar8 = tval_find_idx("none");
  wVar8 = lookup_sval(wVar8,"<curse object>");
  if (1 < z_info->curse_max) {
    uVar15 = 1;
    lVar17 = 0x50;
    poVar12 = curse_object_kind;
    pcVar16 = curses;
    do {
      puVar3 = *(undefined8 **)(pcVar16->conflict_flags + lVar17 + -0x28);
      *puVar3 = poVar12;
      *(char *)((long)puVar3 + 0x3d) = (char)wVar8;
      poVar11 = (object *)puVar3[5];
      if (poVar11 == (object *)0x0) {
        poVar11 = object_new();
        *(object **)(*(long *)(pcVar16->conflict_flags + lVar17 + -0x28) + 0x28) = poVar11;
      }
      poVar12 = curse_object_kind;
      poVar11->kind = curse_object_kind;
      pcVar16 = curses;
      *(char *)(*(long *)(*(long *)(curses->conflict_flags + lVar17 + -0x28) + 0x28) + 0x3d) =
           (char)wVar8;
      poVar11->notice = poVar11->notice | 2;
      uVar15 = uVar15 + 1;
      lVar17 = lVar17 + 0x38;
    } while (uVar15 < z_info->curse_max);
  }
  if (1 < z_info->a_max) {
    uVar15 = 1;
    lVar17 = 0x260;
    do {
      paVar7 = a_info;
      poVar12 = lookup_kind(*(wchar_t *)((long)a_info + lVar17 + -0x100),
                            *(wchar_t *)((long)a_info + lVar17 + -0xfc));
      paVar6 = z_info;
      if ((uint)z_info->ordinary_kind_max < poVar12->kidx) {
        poVar12->level = *(wchar_t *)(paVar7->flags + lVar17 + -0x6c);
        poVar12->effect = *(effect **)(paVar7->flags + lVar17 + -0x4c);
        poVar12->effect_msg = *(char **)(paVar7->flags + lVar17 + -0x44);
        if (poVar12->tval != L'\x13') {
          uVar4 = *(undefined8 *)(paVar7->flags + lVar17 + -0x3c);
          uVar5 = *(undefined8 *)(paVar7->flags + lVar17 + -0x3c + 8);
          (poVar12->time).base = (int)uVar4;
          (poVar12->time).dice = (int)((ulong)uVar4 >> 0x20);
          (poVar12->time).sides = (int)uVar5;
          (poVar12->time).m_bonus = (int)((ulong)uVar5 >> 0x20);
        }
      }
      uVar15 = uVar15 + 1;
      lVar17 = lVar17 + 0x140;
    } while (uVar15 < paVar6->a_max);
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_artifact(struct parser *p) {
	struct artifact *a, *n;
	int none, aidx;

	/* Scan the list for the max id */
	z_info->a_max = 0;
	a = parser_priv(p);
	while (a) {
		z_info->a_max++;
		a = a->next;
	}

	/* Allocate the direct access list and copy the data to it */
	a_info = mem_zalloc((z_info->a_max + 1) * sizeof(*a));
	aup_info = mem_zalloc((z_info->a_max + 1) * sizeof(*aup_info));
	aidx = z_info->a_max;
	for (a = parser_priv(p); a; a = n, aidx--) {
		assert(aidx > 0);

		memcpy(&a_info[aidx], a, sizeof(*a));
		a_info[aidx].aidx = aidx;
		n = a->next;
		a_info[aidx].next = (aidx < z_info->a_max) ?
			&a_info[aidx + 1] : NULL;
		mem_free(a);

		aup_info[aidx].aidx = aidx;
	}
	z_info->a_max += 1;

	/* Now we're done with object kinds, deal with object-like things... */
	none = tval_find_idx("none");
	unknown_item_kind = lookup_kind(none, lookup_sval(none, "<unknown item>"));
	unknown_gold_kind = lookup_kind(none,
									lookup_sval(none, "<unknown treasure>"));
	pile_kind = lookup_kind(none, lookup_sval(none, "<pile>"));
	curse_object_kind = lookup_kind(none, lookup_sval(none, "<curse object>"));
	write_curse_kinds();

	/* ..and fill in all object data */
	for (aidx = 1; aidx < z_info->a_max; aidx++) {
		struct artifact *art = &a_info[aidx];
		struct object_kind *kind = lookup_kind(art->tval, art->sval);
		if (kind->kidx > z_info->ordinary_kind_max) {
			kind->level = art->level;
			kind->effect = art->effect;
			kind->effect_msg = art->effect_msg;
			/*
			 * Timeout for a light already handled in
			 * parse_artifact_time().
			 */
			if (kind->tval != TV_LIGHT) {
				kind->time = art->time;
			}
		}
	}

	parser_destroy(p);
	return 0;
}